

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viff.cxx
# Opt level: O1

void vigra::map_multiband<unsigned_short,unsigned_short>
               (void_vector<unsigned_short> *dest,uint *dest_bands,void_vector<unsigned_short> *src,
               uint src_bands,uint src_width,uint src_height,void_vector<unsigned_short> *maps,
               uint map_bands,uint map_width,uint map_height)

{
  value_type_conflict3 vVar1;
  uint uVar2;
  uint uVar3;
  PreconditionViolation *this;
  long lVar4;
  uint uVar5;
  uint band;
  ulong uVar6;
  ulong uVar7;
  colormap<unsigned_short,_unsigned_short> local_58;
  
  if (src_bands != 1) {
    this = (PreconditionViolation *)__cxa_allocate_exception(0x28);
    PreconditionViolation::PreconditionViolation
              (this,"map_multiband(): Source image must have one band.",
               "/workspace/llm4binary/github/license_c_cmakelists/ukoethe[P]vigra/src/impex/viff.cxx"
               ,0x108);
    __cxa_throw(this,&PreconditionViolation::typeinfo,ContractViolation::~ContractViolation);
  }
  colormap<unsigned_short,_unsigned_short>::colormap(&local_58,map_height,map_bands,map_width);
  if (map_bands != 0) {
    uVar7 = 0;
    uVar6 = 0;
    do {
      colormap<unsigned_short,_unsigned_short>::initialize
                (&local_58,
                 (value_type_conflict3 *)(uVar7 * 2 + (long)(maps->super_void_vector_base).m_data),
                 (uint)uVar6);
      uVar6 = uVar6 + 1;
      uVar7 = (ulong)((int)uVar7 + map_height * map_width);
    } while (map_bands != uVar6);
  }
  uVar2 = src_height * src_width;
  *dest_bands = map_bands * map_width;
  void_vector_base::reserve
            (&dest->super_void_vector_base,(ulong)(map_bands * map_width * uVar2) * 2);
  (dest->super_void_vector_base).m_size = (dest->super_void_vector_base).m_capacity;
  if (map_width < 2) {
    if (*dest_bands != 0) {
      uVar5 = 0;
      band = 0;
      do {
        uVar6 = (ulong)uVar2;
        uVar3 = uVar5;
        if (uVar2 != 0) {
          do {
            vVar1 = colormap<unsigned_short,_unsigned_short>::operator()
                              (&local_58,
                               *(domain_type_conflict *)
                                ((long)(src->super_void_vector_base).m_data + (ulong)uVar3 * 2),band
                              );
            *(value_type_conflict3 *)
             ((long)(dest->super_void_vector_base).m_data + (ulong)uVar3 * 2) = vVar1;
            uVar3 = uVar3 + 1;
            uVar6 = uVar6 - 1;
          } while (uVar6 != 0);
        }
        band = band + 1;
        uVar5 = uVar5 + uVar2;
      } while (band < *dest_bands);
    }
  }
  else if (*dest_bands != 0) {
    lVar4 = 0;
    uVar5 = 0;
    do {
      if (uVar2 != 0) {
        uVar6 = 0;
        do {
          vVar1 = colormap<unsigned_short,_unsigned_short>::operator()
                            (&local_58,
                             *(domain_type_conflict *)
                              ((long)(src->super_void_vector_base).m_data + uVar6 * 2),uVar5);
          *(value_type_conflict3 *)
           ((long)(dest->super_void_vector_base).m_data + (ulong)(uint)((int)lVar4 + (int)uVar6) * 2
           ) = vVar1;
          uVar6 = uVar6 + 1;
        } while (uVar2 != uVar6);
      }
      uVar5 = uVar5 + 1;
      lVar4 = lVar4 + (ulong)uVar2;
    } while (uVar5 < *dest_bands);
  }
  if (local_58.m_tables.super_void_vector_base.m_data != (void *)0x0) {
    operator_delete(local_58.m_tables.super_void_vector_base.m_data);
  }
  return;
}

Assistant:

void map_multiband( void_vector<map_storage_type> & dest,
                        unsigned int & dest_bands,
                        const void_vector<storage_type> & src,
                        unsigned int src_bands, unsigned int src_width, unsigned int src_height,
                        const void_vector<map_storage_type> & maps,
                        unsigned int map_bands, unsigned int map_width, unsigned int map_height )
    {
        vigra_precondition(src_bands == 1u,
               "map_multiband(): Source image must have one band.");

        typedef colormap< storage_type, map_storage_type > colormap_type;
        const unsigned int num_pixels = src_width * src_height;

        // build the color map
        const unsigned int map_band_size = map_width * map_height;
        colormap_type colormap( map_height, map_bands, map_width );
        for ( unsigned int i = 0; i < map_bands; ++i )
            colormap.initialize( maps.data() + map_band_size * i, i );

        // map each pixel
        const unsigned int band_size = src_width * src_height;
        dest_bands = map_bands * map_width;
        dest.resize( band_size * dest_bands );
        if ( map_width > 1 ) {
            // interleaved maps => there is only one band in the image
            for( unsigned int bandnum = 0; bandnum < dest_bands; ++bandnum )
                for( unsigned int i = 0; i < num_pixels; ++i )
                    dest[ bandnum * band_size + i ]
                        = colormap( src[i], bandnum );
        } else {
            // non-interleaved bands => map can be used per band
            for( unsigned int bandnum = 0; bandnum < dest_bands; ++bandnum )
                for( unsigned int i = 0; i < num_pixels; ++i )
                    dest[ bandnum * band_size + i ]
                        = colormap( src[ bandnum * band_size + i ], bandnum );
        }
    }